

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O0

void __thiscall
ocl::OpenCLKernel::setArgs
          (OpenCLKernel *this,Arg *arg0,Arg *arg1,Arg *arg2,Arg *arg3,Arg *arg4,Arg *arg5,Arg *arg6,
          Arg *arg7,Arg *arg8,Arg *arg9,Arg *arg10,Arg *arg11,Arg *arg12,Arg *arg13,Arg *arg14,
          Arg *arg15,Arg *arg16,Arg *arg17,Arg *arg18,Arg *arg19,Arg *arg20,Arg *arg21,Arg *arg22,
          Arg *arg23,Arg *arg24,Arg *arg25,Arg *arg26,Arg *arg27,Arg *arg28,Arg *arg29,Arg *arg30,
          Arg *arg31,Arg *arg32,Arg *arg33,Arg *arg34,Arg *arg35,Arg *arg36,Arg *arg37,Arg *arg38,
          Arg *arg39,Arg *arg40)

{
  Arg *arg4_local;
  Arg *arg3_local;
  Arg *arg2_local;
  Arg *arg1_local;
  Arg *arg0_local;
  OpenCLKernel *this_local;
  
  setArg(this,0,arg0);
  setArg(this,1,arg1);
  setArg(this,2,arg2);
  setArg(this,3,arg3);
  setArg(this,4,arg4);
  setArg(this,5,arg5);
  setArg(this,6,arg6);
  setArg(this,7,arg7);
  setArg(this,8,arg8);
  setArg(this,9,arg9);
  setArg(this,10,arg10);
  setArg(this,0xb,arg11);
  setArg(this,0xc,arg12);
  setArg(this,0xd,arg13);
  setArg(this,0xe,arg14);
  setArg(this,0xf,arg15);
  setArg(this,0x10,arg16);
  setArg(this,0x11,arg17);
  setArg(this,0x12,arg18);
  setArg(this,0x13,arg19);
  setArg(this,0x14,arg20);
  setArg(this,0x15,arg21);
  setArg(this,0x16,arg22);
  setArg(this,0x17,arg23);
  setArg(this,0x18,arg24);
  setArg(this,0x19,arg25);
  setArg(this,0x1a,arg26);
  setArg(this,0x1b,arg27);
  setArg(this,0x1c,arg28);
  setArg(this,0x1d,arg29);
  setArg(this,0x1e,arg30);
  setArg(this,0x1f,arg31);
  setArg(this,0x20,arg32);
  setArg(this,0x21,arg33);
  setArg(this,0x22,arg34);
  setArg(this,0x23,arg35);
  setArg(this,0x24,arg36);
  setArg(this,0x25,arg37);
  setArg(this,0x26,arg38);
  setArg(this,0x27,arg39);
  setArg(this,0x28,arg40);
  return;
}

Assistant:

void setArgs(const Arg &arg0 = Arg(), const Arg &arg1 = Arg(), const Arg &arg2 = Arg(), const Arg &arg3 = Arg(), const Arg &arg4 = Arg(), const Arg &arg5 = Arg(), const Arg &arg6 = Arg(), const Arg &arg7 = Arg(), const Arg &arg8 = Arg(), const Arg &arg9 = Arg(), const Arg &arg10 = Arg(), const Arg &arg11 = Arg(), const Arg &arg12 = Arg(), const Arg &arg13 = Arg(), const Arg &arg14 = Arg(), const Arg &arg15 = Arg(), const Arg &arg16 = Arg(), const Arg &arg17 = Arg(), const Arg &arg18 = Arg(), const Arg &arg19 = Arg(), const Arg &arg20 = Arg(), const Arg &arg21 = Arg(), const Arg &arg22 = Arg(), const Arg &arg23 = Arg(), const Arg &arg24 = Arg(), const Arg &arg25 = Arg(), const Arg &arg26 = Arg(), const Arg &arg27 = Arg(), const Arg &arg28 = Arg(), const Arg &arg29 = Arg(), const Arg &arg30 = Arg(), const Arg &arg31 = Arg(), const Arg &arg32 = Arg(), const Arg &arg33 = Arg(), const Arg &arg34 = Arg(), const Arg &arg35 = Arg(), const Arg &arg36 = Arg(), const Arg &arg37 = Arg(), const Arg &arg38 = Arg(), const Arg &arg39 = Arg(), const Arg &arg40 = Arg())
		{
			setArg( 0, arg0);
			setArg( 1, arg1);
			setArg( 2, arg2);
			setArg( 3, arg3);
			setArg( 4, arg4);
			setArg( 5, arg5);
			setArg( 6, arg6);
			setArg( 7, arg7);
			setArg( 8, arg8);
			setArg( 9, arg9);
			setArg(10, arg10);
			setArg(11, arg11);
			setArg(12, arg12);
			setArg(13, arg13);
			setArg(14, arg14);
			setArg(15, arg15);
			setArg(16, arg16);
			setArg(17, arg17);
			setArg(18, arg18);
			setArg(19, arg19);
			setArg(20, arg20);
			setArg(21, arg21);
			setArg(22, arg22);
			setArg(23, arg23);
			setArg(24, arg24);
			setArg(25, arg25);
			setArg(26, arg26);
			setArg(27, arg27);
			setArg(28, arg28);
			setArg(29, arg29);
			setArg(30, arg30);
			setArg(31, arg31);
			setArg(32, arg32);
			setArg(33, arg33);
			setArg(34, arg34);
			setArg(35, arg35);
			setArg(36, arg36);
			setArg(37, arg37);
			setArg(38, arg38);
			setArg(39, arg39);
			setArg(40, arg40);
		}